

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

GLFWbool openJoystickDevice(char *path)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  float *pfVar4;
  uchar *puVar5;
  long lVar6;
  _GLFWjoylistLinux *p_Var7;
  char buttonCount;
  char axisCount;
  int version;
  char name [256];
  
  memset(name,0,0x100);
  for (lVar6 = 0; lVar6 != 0x380; lVar6 = lVar6 + 0x38) {
    if ((*(int *)((long)&_glfw.linux_js.js[0].present + lVar6) != 0) &&
       (iVar1 = strcmp(*(char **)((long)&_glfw.linux_js.js[0].path + lVar6),path), iVar1 == 0)) {
      return 0;
    }
  }
  p_Var7 = &_glfw.linux_js;
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 0x10) {
      return 0;
    }
    if (p_Var7->js[0].present == 0) break;
    lVar6 = lVar6 + 1;
    p_Var7 = (_GLFWjoylistLinux *)(p_Var7->js + 1);
  }
  iVar1 = open(path,0x800);
  if (iVar1 == -1) {
    return 0;
  }
  ioctl(iVar1,0x80046a01,&version);
  if (version < 0x10000) {
    close(iVar1);
    return 0;
  }
  iVar2 = ioctl(iVar1,0x81006a13,name);
  if (iVar2 < 0) {
    strncpy(name,"Unknown",0x100);
  }
  p_Var7->js[0].present = 1;
  pcVar3 = strdup(name);
  p_Var7->js[0].name = pcVar3;
  pcVar3 = strdup(path);
  p_Var7->js[0].path = pcVar3;
  p_Var7->js[0].fd = iVar1;
  ioctl(iVar1,0x80016a11,&axisCount);
  p_Var7->js[0].axisCount = (int)axisCount;
  pfVar4 = (float *)calloc((long)axisCount,4);
  p_Var7->js[0].axes = pfVar4;
  ioctl(iVar1,0x80016a12,&buttonCount);
  p_Var7->js[0].buttonCount = (int)buttonCount;
  puVar5 = (uchar *)calloc((long)buttonCount,1);
  p_Var7->js[0].buttons = puVar5;
  _glfwInputJoystickChange((int)lVar6,0x40001);
  return 1;
}

Assistant:

static GLFWbool openJoystickDevice(const char* path)
{
    char axisCount, buttonCount;
    char name[256] = "";
    int joy, fd, version;
    _GLFWjoystickLinux* js;

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            continue;

        if (strcmp(_glfw.linux_js.js[joy].path, path) == 0)
            return GLFW_FALSE;
    }

    for (joy = GLFW_JOYSTICK_1;  joy <= GLFW_JOYSTICK_LAST;  joy++)
    {
        if (!_glfw.linux_js.js[joy].present)
            break;
    }

    if (joy > GLFW_JOYSTICK_LAST)
        return GLFW_FALSE;

    fd = open(path, O_RDONLY | O_NONBLOCK);
    if (fd == -1)
        return GLFW_FALSE;

    // Verify that the joystick driver version is at least 1.0
    ioctl(fd, JSIOCGVERSION, &version);
    if (version < 0x010000)
    {
        // It's an old 0.x interface (we don't support it)
        close(fd);
        return GLFW_FALSE;
    }

    if (ioctl(fd, JSIOCGNAME(sizeof(name)), name) < 0)
        strncpy(name, "Unknown", sizeof(name));

    js = _glfw.linux_js.js + joy;
    js->present = GLFW_TRUE;
    js->name = strdup(name);
    js->path = strdup(path);
    js->fd = fd;

    ioctl(fd, JSIOCGAXES, &axisCount);
    js->axisCount = (int) axisCount;
    js->axes = calloc(axisCount, sizeof(float));

    ioctl(fd, JSIOCGBUTTONS, &buttonCount);
    js->buttonCount = (int) buttonCount;
    js->buttons = calloc(buttonCount, 1);

    _glfwInputJoystickChange(joy, GLFW_CONNECTED);
    return GLFW_TRUE;
}